

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Leaf::loadChildren
          (Leaf *this,LDIterator *children)

{
  bool bVar1;
  SelectedSummand *in_RSI;
  long *in_RDI;
  SelectedSummand *s;
  SelectedSummand local_70;
  undefined1 local_40 [64];
  
  while( true ) {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> *)0x407af3);
    if (!bVar1) break;
    Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>::next
              ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> *)0x407b06);
    s = &local_70;
    Kernel::SelectedSummand::SelectedSummand(in_RSI,s);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs((Rhs *)in_RSI,s);
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_40);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x407b46);
    Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x407b50);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::Leaf::loadChildren(LDIterator children)
{
  while(children.hasNext()) {
    // TODO move instead of copying here
    insert(*children.next());
  }
}